

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O2

void post_reentrancy(tsd_t *tsd)

{
  int8_t *piVar1;
  
  piVar1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != '\0') {
    return;
  }
  tsd_slow_update(tsd);
  return;
}

Assistant:

static inline void
post_reentrancy(tsd_t *tsd) {
	int8_t *reentrancy_level = tsd_reentrancy_levelp_get(tsd);
	assert(*reentrancy_level > 0);
	if (--*reentrancy_level == 0) {
		tsd_slow_update(tsd);
	}
}